

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiWindowSettings * ImGui::FindWindowSettings(ImGuiID id)

{
  ImGuiContext *pIVar1;
  ImGuiWindowSettings *pIVar2;
  ImGuiID in_EDI;
  int i;
  ImGuiContext *g;
  int local_1c;
  
  pIVar1 = GImGui;
  local_1c = 0;
  while( true ) {
    if (local_1c == (pIVar1->SettingsWindows).Size) {
      return (ImGuiWindowSettings *)0x0;
    }
    pIVar2 = ImVector<ImGuiWindowSettings>::operator[](&pIVar1->SettingsWindows,local_1c);
    if (pIVar2->ID == in_EDI) break;
    local_1c = local_1c + 1;
  }
  pIVar2 = ImVector<ImGuiWindowSettings>::operator[](&pIVar1->SettingsWindows,local_1c);
  return pIVar2;
}

Assistant:

ImGuiWindowSettings* ImGui::FindWindowSettings(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    for (int i = 0; i != g.SettingsWindows.Size; i++)
        if (g.SettingsWindows[i].ID == id)
            return &g.SettingsWindows[i];
    return NULL;
}